

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_dictionary.h
# Opt level: O2

void __thiscall c74::min::dict::dict(dict *this,t_dictionary *d,bool take_ownership)

{
  this->m_instance = (t_dictionary *)0x0;
  this->m_has_ownership = true;
  if (d == (t_dictionary *)0x0) {
    d = (t_dictionary *)dictionary_new();
  }
  else if (take_ownership) {
    object_retain(d);
  }
  else {
    this->m_has_ownership = false;
  }
  this->m_instance = d;
  return;
}

Assistant:

dict(max::t_dictionary* d = nullptr, const bool take_ownership = true)
    {
        if (d == nullptr) {
            m_instance = max::dictionary_new();
        }
        else {
            if (take_ownership) {
                max::object_retain((max::t_object*)d);
            }
            else {
                m_has_ownership = false;
            }
            m_instance = d;
        }
    }